

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O1

SUNAdaptController SUNAdaptController_PID(SUNContext_conflict sunctx)

{
  undefined8 *puVar1;
  SUNAdaptController p_Var2;
  
  p_Var2 = SUNAdaptController_Soderlind(sunctx);
  puVar1 = (undefined8 *)p_Var2->content;
  *puVar1 = 0x3fe28f5c28f5c28f;
  puVar1[1] = 0xbfcae147ae147ae1;
  puVar1[2] = 0x3fb999999999999a;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined4 *)((long)puVar1 + 0x54) = 2;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_PID(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(SUNAdaptController_SetParams_PID(C, DEFAULT_PID_K1,
                                                    DEFAULT_PID_K2,
                                                    DEFAULT_PID_K3));

  return (C);
}